

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderAdjacencyTests::createGrid
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  uint uVar1;
  AdjacencyGrid *this_00;
  AdjacencyGridLineSegment *pAVar2;
  AdjacencyGridPoint *pAVar3;
  TestError *this_01;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  this_00 = (AdjacencyGrid *)operator_new(0x60);
  AdjacencyGrid::AdjacencyGrid(this_00);
  test_data->m_grid = this_00;
  uVar1 = this->m_grid_granulity;
  uVar7 = (uVar1 + 1) * (uVar1 + 1);
  this_00->m_n_points = uVar7;
  pAVar2 = (AdjacencyGridLineSegment *)
           operator_new__((ulong)(uVar1 * uVar1 * this->m_n_line_segments) << 5);
  this_00->m_line_segments = pAVar2;
  pAVar3 = (AdjacencyGridPoint *)operator_new__((ulong)uVar7 * 0xc);
  this_00->m_points = pAVar3;
  if (uVar1 != 0xffffffff) {
    iVar4 = 0;
    uVar7 = 0;
    do {
      uVar5 = 0;
      do {
        uVar6 = iVar4 + uVar5;
        pAVar3[uVar6].index = uVar6;
        pAVar3[uVar6].x = (float)uVar5 * (1.0 / (float)uVar1);
        pAVar3[uVar6].y = (float)uVar7 * (1.0 / (float)uVar1);
        uVar5 = uVar5 + 1;
      } while (uVar1 + 1 != uVar5);
      iVar4 = iVar4 + uVar5;
      bVar8 = uVar7 != uVar1;
      uVar7 = uVar7 + 1;
    } while (bVar8);
  }
  switch(test_data->m_mode) {
  case 10:
    createGridLineSegments(this,test_data);
    return;
  case 0xb:
    createGridLineSegments(this,test_data);
    createGridLineStrip(this,test_data);
    return;
  case 0xc:
    createGridTriangles(this,test_data);
    return;
  case 0xd:
    createGridTriangles(this,test_data);
    createGridTriangleStrip(this,test_data);
    return;
  default:
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Unrecognized test mode",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacencyTests.cpp"
               ,0x18d);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
}

Assistant:

void GeometryShaderAdjacencyTests::createGrid(AdjacencyTestData& test_data)
{
	/* Create a grid object */
	test_data.m_grid = new AdjacencyGrid;

	/* Allocate space for grid elements */
	test_data.m_grid->m_n_points = (m_grid_granulity + 1) * (m_grid_granulity + 1);
	test_data.m_grid->m_line_segments =
		new AdjacencyGridLineSegment[m_n_line_segments * m_grid_granulity * m_grid_granulity];
	test_data.m_grid->m_points = new AdjacencyGridPoint[test_data.m_grid->m_n_points];

	/* Generate points */
	float		 dx		= 1.0f / static_cast<float>(m_grid_granulity);
	float		 dy		= 1.0f / static_cast<float>(m_grid_granulity);
	unsigned int nPoint = 0;

	for (unsigned int y = 0; y < m_grid_granulity + 1; ++y)
	{
		for (unsigned int x = 0; x < m_grid_granulity + 1; ++x, ++nPoint)
		{
			test_data.m_grid->m_points[nPoint].index = nPoint;
			test_data.m_grid->m_points[nPoint].x	 = dx * static_cast<float>(x);
			test_data.m_grid->m_points[nPoint].y	 = dy * static_cast<float>(y);
		}
	}

	switch (test_data.m_mode)
	{
	case GL_LINES_ADJACENCY_EXT:
	{
		/* Generate line segment data*/
		createGridLineSegments(test_data);

		break;
	}

	case GL_LINE_STRIP_ADJACENCY_EXT:
	{
		/* Line strip data generation requires line segment data to be present */
		createGridLineSegments(test_data);

		/* Generate line strip data */
		createGridLineStrip(test_data);

		break;
	}

	case GL_TRIANGLES_ADJACENCY_EXT:
	{
		/* Generate triangles data */
		createGridTriangles(test_data);

		break;
	}

	case GL_TRIANGLE_STRIP_ADJACENCY_EXT:
	{
		/* Triangle strip data generation requires triangle data to be present */
		createGridTriangles(test_data);

		/* Generate triangle strip data */
		createGridTriangleStrip(test_data);

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized test mode");
	}
	}
}